

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberMinus_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint32_t local_30;
  undefined1 local_2c [4];
  uint32_t status;
  decNumber dzero;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *res_local;
  
  local_30 = 0;
  dzero._4_8_ = set;
  uprv_decNumberZero_63((decNumber *)local_2c);
  status = rhs->exponent;
  decAddOp(res,(decNumber *)local_2c,rhs,(decContext *)dzero._4_8_,0x80,&local_30);
  if (local_30 != 0) {
    decStatus(res,local_30,(decContext *)dzero._4_8_);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberMinus(decNumber *res, const decNumber *rhs,
                           decContext *set) {
  decNumber dzero;
  uInt status=0;                        /* accumulator  */

  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  uprv_decNumberZero(&dzero);                /* make 0  */
  dzero.exponent=rhs->exponent;         /* [no coefficient expansion]  */
  decAddOp(res, &dzero, rhs, set, DECNEG, &status);
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }